

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

size_t coda_revxspn(char *s,char *n,size_t len)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  __int32_t **pp_Var5;
  char *pcVar6;
  long lVar7;
  
  lVar1 = len - 1;
  lVar7 = lVar1;
  if (0 < (long)len) {
    cVar2 = *n;
    cVar4 = cVar2;
    do {
      if (cVar4 == '\0') goto LAB_00105557;
      if (cVar2 != '\0') {
        pp_Var5 = __ctype_tolower_loc();
        pcVar6 = n + 1;
        cVar4 = cVar2;
        do {
          if ((*pp_Var5)[s[lVar7]] == (*pp_Var5)[cVar4]) goto LAB_00105543;
          cVar4 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        } while (cVar4 != '\0');
      }
      cVar4 = '\0';
LAB_00105543:
      bVar3 = 0 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar3);
    lVar7 = -1;
  }
LAB_00105557:
  return lVar1 - lVar7;
}

Assistant:

size_t coda_revxspn(const char *s, const char *n, size_t len)
{
	const char *b = s - 1;
	const char *p = s - 1 + len;
	const char *x = n;

	for (; p > b && *x; --p)
	{
		for (x = n; *x; ++x)
		{
			if (tolower(*p) == tolower(*x)) break;
		}
	}

	return s - 1 + len - p;
}